

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O2

size_type __thiscall
cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::getUserSize
          (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this,void *ptr)

{
  size_type sVar1;
  
  if ((ptr != (void *)0x0) && ((*(byte *)((long)ptr + -8) & 1) != 0)) {
    sVar1 = MemChunk::getUserSize((MemChunk *)((long)ptr + -0x10));
    return sVar1;
  }
  return 0;
}

Assistant:

size_type
    getUserSize (T* ptr)
    {
        if (ptr == nullptr)
        {
            return 0;
        }
        MemChunk* chunk = mem2Chunk (ptr);
        if (chunk->isUsed ())
        {
            return chunk->getUserSize ();
        }
        return 0;
    }